

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O2

int nsPop(xmlParserCtxtPtr ctxt,int nr)

{
  xmlGenericErrorFunc p_Var1;
  uint in_EAX;
  xmlGenericErrorFunc *pp_Var2;
  void **ppvVar3;
  ulong uVar4;
  uint uVar5;
  bool bVar6;
  
  if (ctxt->nsTab != (xmlChar **)0x0) {
    in_EAX = ctxt->nsNr;
    if (ctxt->nsNr < nr) {
      pp_Var2 = __xmlGenericError();
      p_Var1 = *pp_Var2;
      ppvVar3 = __xmlGenericErrorContext();
      (*p_Var1)(*ppvVar3,"Pbm popping %d NS\n",nr);
      nr = ctxt->nsNr;
      in_EAX = nr;
    }
    uVar4 = (ulong)in_EAX;
    if (0 < (int)in_EAX) {
      uVar5 = 0;
      if (0 < nr) {
        uVar5 = nr;
      }
      while( true ) {
        in_EAX = (int)uVar4 - 1;
        bVar6 = uVar5 == 0;
        uVar5 = uVar5 - 1;
        if (bVar6) break;
        ctxt->nsNr = in_EAX;
        uVar4 = (ulong)(int)in_EAX;
        ctxt->nsTab[uVar4] = (xmlChar *)0x0;
      }
    }
  }
  return in_EAX;
}

Assistant:

static int
nsPop(xmlParserCtxtPtr ctxt, int nr)
{
    int i;

    if (ctxt->nsTab == NULL) return(0);
    if (ctxt->nsNr < nr) {
        xmlGenericError(xmlGenericErrorContext, "Pbm popping %d NS\n", nr);
        nr = ctxt->nsNr;
    }
    if (ctxt->nsNr <= 0)
        return (0);

    for (i = 0;i < nr;i++) {
         ctxt->nsNr--;
	 ctxt->nsTab[ctxt->nsNr] = NULL;
    }
    return(nr);
}